

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

bool __thiscall ON_Hatch::GetBBox(ON_Hatch *this,double *bmin,double *bmax,bool bGrowBox)

{
  int iVar1;
  int iVar2;
  ON_Curve *pOVar3;
  int index;
  char cVar4;
  
  iVar1 = (this->m_loops).m_count;
  if (iVar1 < 1) {
    cVar4 = '\x01';
  }
  else {
    index = 0;
    do {
      pOVar3 = LoopCurve3d(this,index);
      if (pOVar3 == (ON_Curve *)0x0) {
        cVar4 = '\x01';
      }
      else {
        iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                          (pOVar3,bmin,bmax,(ulong)(index != 0 || bGrowBox));
        cVar4 = (char)iVar2;
        (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar3);
      }
    } while ((cVar4 != '\0') && (index = index + 1, index < iVar1));
  }
  return (bool)cVar4;
}

Assistant:

bool ON_Hatch::GetBBox( double* bmin, double* bmax, bool bGrowBox) const
{
  int i;
  int count = m_loops.Count();
  bool rc = true;
  ON_Curve* pC;
  for( i = 0; rc && i < count; i++)
  {
    pC = LoopCurve3d( i);
    if( pC)
    {
      rc = pC->GetBBox( bmin, bmax, i?true:bGrowBox);
      delete pC;
    }
  }
  return rc;
}